

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O2

CURLcode Curl_getinfo(Curl_easy *data,CURLINFO info,...)

{
  int iVar1;
  char *pcVar2;
  connectdata *pcVar3;
  byte bVar4;
  curl_socket_t cVar5;
  curl_sslbackend cVar6;
  curl_slist *pcVar7;
  void *pvVar8;
  uint uVar9;
  long lVar10;
  char *pcVar11;
  ssl_connect_data *psVar12;
  CURLcode CVar13;
  double dVar14;
  double dStack_100;
  va_list arg;
  double *local_c8;
  
  if (data == (Curl_easy *)0x0) {
    return CURLE_UNKNOWN_OPTION;
  }
  CVar13 = CURLE_UNKNOWN_OPTION;
  switch((info & 0xf00000) - 0x100000 >> 0x14) {
  case CURLINFO_NONE:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_FTP_ENTRY_PATH:
      pcVar11 = (data->state).most_recent_ftp_entrypath;
      break;
    case CURLINFO_REDIRECT_URL:
      pcVar11 = (data->info).wouldredirect;
      break;
    case CURLINFO_PRIMARY_IP:
      pcVar11 = (data->info).conn_primary_ip;
      break;
    case 0x100021:
    case 0x100022:
    case 0x100023:
    case 0x100025:
    case 0x100026:
    case 0x100027:
    case 0x100028:
      goto switchD_0011e213_default;
    case CURLINFO_RTSP_SESSION_ID:
      pcVar11 = (data->set).str[0x32];
      break;
    case CURLINFO_LOCAL_IP:
      pcVar11 = (data->info).conn_local_ip;
      break;
    default:
      if (info == CURLINFO_REFERER) {
        pcVar11 = (data->state).referer;
      }
      else if (info == CURLINFO_CONTENT_TYPE) {
        pcVar11 = (data->info).contenttype;
      }
      else if (info == CURLINFO_PRIVATE) {
        pcVar11 = (char *)(data->set).private_data;
      }
      else if (info == CURLINFO_SCHEME) {
        pcVar11 = (data->info).conn_scheme;
      }
      else if (info == CURLINFO_EFFECTIVE_METHOD) {
        pcVar11 = (data->set).str[6];
        if (pcVar11 == (char *)0x0) {
          if (((data->set).field_0x9a3 & 0x10) == 0) {
            uVar9 = (data->state).httpreq - HTTPREQ_POST;
            if (uVar9 < 5) {
              pcVar11 = &DAT_00157068 + *(int *)(&DAT_00157068 + (ulong)uVar9 * 4);
            }
            else {
              pcVar11 = "GET";
            }
          }
          else {
            pcVar11 = "HEAD";
          }
        }
      }
      else {
        if (info != CURLINFO_EFFECTIVE_URL) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar2 = (data->state).url;
        pcVar11 = "";
        if (pcVar2 != (char *)0x0) {
          pcVar11 = pcVar2;
        }
      }
    }
    goto LAB_0011e7a2;
  case 1:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_HEADER_SIZE:
      dStack_100 = (double)(data->info).header_size;
      break;
    case CURLINFO_REQUEST_SIZE:
      dStack_100 = (double)(data->info).request_size;
      break;
    case CURLINFO_SSL_VERIFYRESULT:
      dStack_100 = (double)(data->set).ssl.certverifyresult;
      break;
    case CURLINFO_FILETIME:
      dStack_100 = (double)(data->info).filetime;
      break;
    case 0x20000f:
    case 0x200010:
    case 0x200011:
    case 0x200012:
    case 0x200013:
    case 0x200015:
    case 0x20001b:
    case 0x20001c:
    case 0x20001e:
    case 0x20001f:
    case 0x200020:
    case 0x200021:
    case 0x200022:
    case 0x200024:
    case 0x200029:
    case 0x20002b:
    case 0x20002c:
    case 0x20002d:
    case 0x200031:
    case 0x200032:
    case 0x200033:
    case 0x200034:
    case 0x200035:
    case 0x200036:
    case 0x200037:
    case 0x200038:
    case 0x200039:
    case 0x20003a:
      goto switchD_0011e213_default;
    case CURLINFO_REDIRECT_COUNT:
      dStack_100 = (double)(data->state).followlocation;
      break;
    case CURLINFO_HTTP_CONNECTCODE:
      dStack_100 = (double)(long)(data->info).httpproxycode;
      break;
    case CURLINFO_HTTPAUTH_AVAIL:
      dStack_100 = (double)(data->info).httpauthavail;
      break;
    case CURLINFO_PROXYAUTH_AVAIL:
      dStack_100 = (double)(data->info).proxyauthavail;
      break;
    case CURLINFO_OS_ERRNO:
      dStack_100 = (double)(long)(data->state).os_errno;
      break;
    case CURLINFO_NUM_CONNECTS:
      dStack_100 = (double)(data->info).numconnects;
      break;
    case CURLINFO_LASTSOCKET:
      cVar5 = Curl_getconnectinfo(data,(connectdata **)0x0);
      dStack_100 = (double)(long)cVar5;
      break;
    case CURLINFO_CONDITION_UNMET:
      if ((data->info).httpcode == 0x130) {
LAB_0011e8bb:
        dStack_100 = 4.94065645841247e-324;
      }
      else {
        dStack_100 = (double)(ulong)((byte)(data->info).field_0xe4 & 1);
      }
      break;
    case CURLINFO_RTSP_CLIENT_CSEQ:
      dStack_100 = (double)(data->state).rtsp_next_client_CSeq;
      break;
    case CURLINFO_RTSP_SERVER_CSEQ:
      dStack_100 = (double)(data->state).rtsp_next_server_CSeq;
      break;
    case CURLINFO_RTSP_CSEQ_RECV:
      dStack_100 = (double)(data->state).rtsp_CSeq_recv;
      break;
    case CURLINFO_PRIMARY_PORT:
      dStack_100 = (double)(long)(data->info).conn_primary_port;
      break;
    case CURLINFO_LOCAL_PORT:
      dStack_100 = (double)(long)(data->info).conn_local_port;
      break;
    case CURLINFO_HTTP_VERSION:
      iVar1 = (data->info).httpversion;
      if (iVar1 == 10) goto LAB_0011e8bb;
      if (iVar1 == 0x1e) {
        dStack_100 = 1.48219693752374e-322;
      }
      else if (iVar1 == 0x14) {
        dStack_100 = 1.48219693752374e-323;
      }
      else if (iVar1 == 0xb) {
        dStack_100 = 9.88131291682493e-324;
      }
      else {
        dStack_100 = 0.0;
      }
      break;
    case CURLINFO_PROXY_SSL_VERIFYRESULT:
      dStack_100 = (double)(data->set).proxy_ssl.certverifyresult;
      break;
    case CURLINFO_PROTOCOL:
      dStack_100 = (double)(ulong)(data->info).conn_protocol;
      break;
    case CURLINFO_PROXY_ERROR:
      dStack_100 = (double)(ulong)(data->info).pxcode;
      break;
    default:
      if (info != CURLINFO_RESPONSE_CODE) {
        return CURLE_UNKNOWN_OPTION;
      }
      dStack_100 = (double)(long)(data->info).httpcode;
    }
    *local_c8 = dStack_100;
    goto LAB_0011e8d6;
  case 2:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    break;
  case 3:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    if (info == CURLINFO_TLS_SSL_PTR) {
LAB_0011e52a:
      pcVar3 = data->conn;
      *local_c8 = (double)&data->tsi;
      cVar6 = Curl_ssl_backend();
      (data->tsi).backend = cVar6;
      (data->tsi).internals = (void *)0x0;
      if (cVar6 == CURLSSLBACKEND_NONE || pcVar3 == (connectdata *)0x0) {
        return CURLE_OK;
      }
      if ((pcVar3->ssl[0].field_0x10 & 1) == 0) {
        if ((pcVar3->ssl[1].field_0x10 & 1) == 0) {
          return CURLE_OK;
        }
        psVar12 = pcVar3->ssl + 1;
      }
      else {
        psVar12 = pcVar3->ssl;
      }
      pvVar8 = (*Curl_ssl->get_internals)(psVar12,info);
      (data->tsi).internals = pvVar8;
      return CURLE_OK;
    }
    if (info == CURLINFO_COOKIELIST) {
      pcVar7 = Curl_cookie_list(data);
    }
    else {
      if (info == CURLINFO_CERTINFO) {
        *local_c8 = (double)&(data->info).certs;
        goto LAB_0011e8d6;
      }
      if (info == CURLINFO_TLS_SESSION) goto LAB_0011e52a;
      if (info != CURLINFO_SSL_ENGINES) {
        return CURLE_UNKNOWN_OPTION;
      }
      pcVar7 = Curl_ssl_engines_list(data);
    }
    *local_c8 = (double)pcVar7;
    goto LAB_0011e8d6;
  case 4:
    if (info != CURLINFO_ACTIVESOCKET) {
      return CURLE_UNKNOWN_OPTION;
    }
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    cVar5 = Curl_getconnectinfo(data,(connectdata **)0x0);
    *(curl_socket_t *)local_c8 = cVar5;
    return CURLE_OK;
  case 5:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_TOTAL_TIME_T:
      lVar10 = 0xba8;
      break;
    case CURLINFO_NAMELOOKUP_TIME_T:
      lVar10 = 0xbc0;
      break;
    case CURLINFO_CONNECT_TIME_T:
      lVar10 = 0xbc8;
      break;
    case CURLINFO_PRETRANSFER_TIME_T:
      lVar10 = 0xbd8;
      break;
    case CURLINFO_STARTTRANSFER_TIME_T:
      lVar10 = 0xbe0;
      break;
    case CURLINFO_REDIRECT_TIME_T:
      lVar10 = 0xbe8;
      break;
    case CURLINFO_APPCONNECT_TIME_T:
      lVar10 = 0xbd0;
      break;
    case CURLINFO_RETRY_AFTER:
      lVar10 = 0x1400;
      break;
    default:
      switch(info) {
      case CURLINFO_SIZE_UPLOAD_T:
        lVar10 = 0xb90;
        break;
      case CURLINFO_SIZE_DOWNLOAD_T:
        lVar10 = 0xb88;
        break;
      case CURLINFO_SPEED_DOWNLOAD_T:
        lVar10 = 0xbb0;
        break;
      case CURLINFO_SPEED_UPLOAD_T:
        lVar10 = 3000;
        break;
      default:
        goto switchD_0011e213_default;
      case CURLINFO_FILETIME_T:
        lVar10 = 0x13c0;
        break;
      case CURLINFO_CONTENT_LENGTH_DOWNLOAD_T:
        lVar10 = 0xb78;
        bVar4 = (byte)(data->progress).flags & 0x40;
        goto joined_r0x0011e761;
      case CURLINFO_CONTENT_LENGTH_UPLOAD_T:
        lVar10 = 0xb80;
        bVar4 = (byte)(data->progress).flags & 0x20;
joined_r0x0011e761:
        if (bVar4 != 0) break;
        pcVar11 = (char *)0xffffffffffffffff;
        goto LAB_0011e7a2;
      }
    }
    pcVar11 = *(char **)((long)&data->magic + lVar10);
LAB_0011e7a2:
    *local_c8 = (double)pcVar11;
    goto LAB_0011e8d6;
  default:
    goto switchD_0011e213_default;
  }
  switch(info) {
  case CURLINFO_TOTAL_TIME:
    dVar14 = (double)(data->progress).timespent;
    break;
  case CURLINFO_NAMELOOKUP_TIME:
    dVar14 = (double)(data->progress).t_nslookup;
    break;
  case CURLINFO_CONNECT_TIME:
    dVar14 = (double)(data->progress).t_connect;
    break;
  case CURLINFO_PRETRANSFER_TIME:
    dVar14 = (double)(data->progress).t_pretransfer;
    break;
  case CURLINFO_SIZE_UPLOAD:
    dVar14 = (double)(data->progress).uploaded;
    goto LAB_0011e6cd;
  case CURLINFO_SIZE_DOWNLOAD:
    dVar14 = (double)(data->progress).downloaded;
    goto LAB_0011e6cd;
  case CURLINFO_SPEED_DOWNLOAD:
    dVar14 = (double)(data->progress).dlspeed;
    goto LAB_0011e6cd;
  case CURLINFO_SPEED_UPLOAD:
    dVar14 = (double)(data->progress).ulspeed;
    goto LAB_0011e6cd;
  default:
    goto switchD_0011e213_default;
  case CURLINFO_CONTENT_LENGTH_DOWNLOAD:
    if (((data->progress).flags & 0x40) == 0) {
LAB_0011e70d:
      dVar14 = -1.0;
    }
    else {
      dVar14 = (double)(data->progress).size_dl;
    }
    goto LAB_0011e6cd;
  case CURLINFO_CONTENT_LENGTH_UPLOAD:
    if (((data->progress).flags & 0x20) == 0) goto LAB_0011e70d;
    dVar14 = (double)(data->progress).size_ul;
    goto LAB_0011e6cd;
  case CURLINFO_STARTTRANSFER_TIME:
    dVar14 = (double)(data->progress).t_starttransfer;
    break;
  case CURLINFO_REDIRECT_TIME:
    dVar14 = (double)(data->progress).t_redirect;
    break;
  case CURLINFO_APPCONNECT_TIME:
    dVar14 = (double)(data->progress).t_appconnect;
  }
  dVar14 = dVar14 / 1000000.0;
LAB_0011e6cd:
  *local_c8 = dVar14;
LAB_0011e8d6:
  CVar13 = CURLE_OK;
switchD_0011e213_default:
  return CVar13;
}

Assistant:

CURLcode Curl_getinfo(struct Curl_easy *data, CURLINFO info, ...)
{
  va_list arg;
  long *param_longp = NULL;
  double *param_doublep = NULL;
  curl_off_t *param_offt = NULL;
  const char **param_charp = NULL;
  struct curl_slist **param_slistp = NULL;
  curl_socket_t *param_socketp = NULL;
  int type;
  CURLcode result = CURLE_UNKNOWN_OPTION;

  if(!data)
    return result;

  va_start(arg, info);

  type = CURLINFO_TYPEMASK & (int)info;
  switch(type) {
  case CURLINFO_STRING:
    param_charp = va_arg(arg, const char **);
    if(param_charp)
      result = getinfo_char(data, info, param_charp);
    break;
  case CURLINFO_LONG:
    param_longp = va_arg(arg, long *);
    if(param_longp)
      result = getinfo_long(data, info, param_longp);
    break;
  case CURLINFO_DOUBLE:
    param_doublep = va_arg(arg, double *);
    if(param_doublep)
      result = getinfo_double(data, info, param_doublep);
    break;
  case CURLINFO_OFF_T:
    param_offt = va_arg(arg, curl_off_t *);
    if(param_offt)
      result = getinfo_offt(data, info, param_offt);
    break;
  case CURLINFO_SLIST:
    param_slistp = va_arg(arg, struct curl_slist **);
    if(param_slistp)
      result = getinfo_slist(data, info, param_slistp);
    break;
  case CURLINFO_SOCKET:
    param_socketp = va_arg(arg, curl_socket_t *);
    if(param_socketp)
      result = getinfo_socket(data, info, param_socketp);
    break;
  default:
    break;
  }

  va_end(arg);

  return result;
}